

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_rawfile_open(char *filename,int rwmode,int *hdl)

{
  bool bVar1;
  char *pcVar2;
  double *dvalues;
  size_t sVar3;
  char *local_4d8;
  void *ptr;
  char *cptr2;
  char *cptr;
  char rootfile [1025];
  size_t datasize;
  size_t filesize;
  long offset;
  long nvals;
  long ii;
  long dim [5];
  int local_54;
  int local_50;
  int naxis;
  int bytePerPix;
  int datatype;
  int endian;
  int status;
  short *sptr;
  fitsfile *fptr;
  FILE *diskfile;
  int *hdl_local;
  char *pcStack_18;
  int rwmode_local;
  char *filename_local;
  
  diskfile = (FILE *)hdl;
  hdl_local._4_4_ = rwmode;
  pcStack_18 = filename;
  memset(&ii,0,0x28);
  ii = 1;
  dim[0] = 1;
  dim[1] = 1;
  dim[2] = 1;
  dim[3] = 1;
  filesize = 0;
  datasize = 0;
  cptr2 = (char *)0x0;
  ptr = (void *)0x0;
  if (hdl_local._4_4_ == 0) {
    cptr2 = strchr(pcStack_18,0x5b);
    if (cptr2 == (char *)0x0) {
      ffpmsg("binary file name missing \'[\' character (mem_rawfile_open)");
      ffpmsg(pcStack_18);
      filename_local._4_4_ = 0x7d;
    }
    else {
      cptr._0_1_ = 0;
      strncat((char *)&cptr,pcStack_18,(long)cptr2 - (long)pcStack_18);
      do {
        pcVar2 = cptr2;
        cptr2 = pcVar2 + 1;
      } while (*cptr2 == ' ');
      if ((*cptr2 == 'b') || (*cptr2 == 'B')) {
        naxis = 8;
        local_50 = 1;
      }
      else if ((*cptr2 == 'i') || (*cptr2 == 'I')) {
        naxis = 0x10;
        local_50 = 2;
      }
      else if ((*cptr2 == 'u') || (*cptr2 == 'U')) {
        naxis = 0x14;
        local_50 = 2;
      }
      else if ((*cptr2 == 'j') || (*cptr2 == 'J')) {
        naxis = 0x20;
        local_50 = 4;
      }
      else if ((((*cptr2 == 'r') || (*cptr2 == 'R')) || (*cptr2 == 'f')) || (*cptr2 == 'F')) {
        naxis = -0x20;
        local_50 = 4;
      }
      else {
        if ((*cptr2 != 'd') && (*cptr2 != 'D')) {
          ffpmsg("error in raw binary file datatype (mem_rawfile_open)");
          ffpmsg(pcStack_18);
          return 0x7d;
        }
        naxis = -0x40;
        local_50 = 8;
      }
      cptr2 = pcVar2 + 2;
      if ((*cptr2 == 'b') || (*cptr2 == 'B')) {
        bVar1 = false;
        cptr2 = pcVar2 + 3;
      }
      else {
        if ((*cptr2 == 'l') || (*cptr2 == 'L')) {
          cptr2 = pcVar2 + 3;
        }
        bVar1 = true;
      }
      local_54 = 1;
      ii = strtol(cptr2,(char **)&ptr,10);
      if ((ptr != (void *)0x0) && (*ptr == ',')) {
        local_54 = 2;
        dim[0] = strtol((char *)((long)ptr + 1),&cptr2,10);
        if ((cptr2 != (char *)0x0) && (*cptr2 == ',')) {
          local_54 = 3;
          dim[1] = strtol(cptr2 + 1,(char **)&ptr,10);
          if ((ptr != (void *)0x0) && (*ptr == ',')) {
            local_54 = 4;
            dim[2] = strtol((char *)((long)ptr + 1),&cptr2,10);
            if ((cptr2 != (char *)0x0) && (*cptr2 == ',')) {
              local_54 = 5;
            }
            dim[3] = strtol(cptr2 + 1,(char **)&ptr,10);
          }
        }
      }
      if (ptr < cptr2) {
        local_4d8 = cptr2;
      }
      else {
        local_4d8 = (char *)ptr;
      }
      cptr2 = local_4d8;
      if (*local_4d8 == ':') {
        filesize = strtol(local_4d8 + 1,(char **)0x0,10);
      }
      offset = ii * dim[0] * dim[1] * dim[2] * dim[3];
      register0x00000000 = offset * local_50;
      datasize = ((offset * local_50 + 0xb3fU) / 0xb40 + 1) * 0xb40;
      datatype = file_openfile((char *)&cptr,0,(FILE **)&fptr);
      if (datatype == 0) {
        datatype = mem_createmem(datasize,&diskfile->_flags);
        if (datatype == 0) {
          ffimem((fitsfile **)&sptr,memTable[diskfile->_flags].memaddrptr,&datasize,0,
                 (_func_void_ptr_void_ptr_size_t *)0x0,&datatype);
          ffcrim((fitsfile *)sptr,naxis,local_54,&ii,&datatype);
          ffclos((fitsfile *)sptr,&datatype);
          if (datatype < 1) {
            if (0 < (long)filesize) {
              fseek((FILE *)fptr,filesize,0);
            }
            dvalues = (double *)(*memTable[diskfile->_flags].memaddrptr + 0xb40);
            sVar3 = fread(dvalues,1,stack0xffffffffffffff50,(FILE *)fptr);
            if (sVar3 != stack0xffffffffffffff50) {
              datatype = 0x6c;
            }
            fclose((FILE *)fptr);
            if (datatype == 0) {
              if (naxis == 0x14) {
                _endian = dvalues;
                if (bVar1) {
                  for (nvals = 0; nvals < offset; nvals = nvals + 1) {
                    *(ushort *)_endian = *(ushort *)_endian ^ 0x8000;
                    _endian = (double *)((long)_endian + 2);
                  }
                }
                else {
                  for (nvals = 0; nvals < offset; nvals = nvals + 1) {
                    *(ushort *)_endian = *(ushort *)_endian ^ 0x80;
                    _endian = (double *)((long)_endian + 2);
                  }
                }
              }
              if (bVar1) {
                if ((naxis == 0x10) || (naxis == 0x14)) {
                  ffswap2((short *)dvalues,offset);
                }
                else if ((naxis == 0x20) || (naxis == -0x20)) {
                  ffswap4((int *)dvalues,offset);
                }
                else if (naxis == -0x40) {
                  ffswap8(dvalues,offset);
                }
              }
              memTable[diskfile->_flags].currentpos = 0;
              memTable[diskfile->_flags].fitsfilesize = datasize;
              filename_local._4_4_ = 0;
            }
            else {
              mem_close_free(diskfile->_flags);
              ffpmsg("failed to copy raw file data into memory (mem_rawfile_open)");
              filename_local._4_4_ = datatype;
            }
          }
          else {
            ffpmsg("failed to write basic image header (mem_rawfile_open)");
            fclose((FILE *)fptr);
            mem_close_free(diskfile->_flags);
            filename_local._4_4_ = datatype;
          }
        }
        else {
          ffpmsg("failed to create memory file (mem_rawfile_open)");
          fclose((FILE *)fptr);
          filename_local._4_4_ = datatype;
        }
      }
      else {
        ffpmsg("failed to open raw  binary file (mem_rawfile_open)");
        ffpmsg((char *)&cptr);
        filename_local._4_4_ = datatype;
      }
    }
  }
  else {
    ffpmsg("cannot open raw binary file with WRITE access (mem_rawfile_open)");
    ffpmsg(pcStack_18);
    filename_local._4_4_ = 0x70;
  }
  return filename_local._4_4_;
}

Assistant:

int mem_rawfile_open(char *filename, int rwmode, int *hdl)
/*
  This routine creates an empty memory buffer, writes a minimal
  image header, then copies the image data from the raw file into
  memory.  It will byteswap the pixel values if the raw array
  is in little endian byte order.
*/
{
    FILE *diskfile;
    fitsfile *fptr;
    short *sptr;
    int status, endian, datatype, bytePerPix, naxis;
    long dim[5] = {1,1,1,1,1}, ii, nvals, offset = 0;
    size_t filesize = 0, datasize;
    char rootfile[FLEN_FILENAME], *cptr = 0, *cptr2 = 0;
    void *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open raw binary file with WRITE access (mem_rawfile_open)");
        ffpmsg(filename);
        return(READONLY_FILE);
    }

    cptr = strchr(filename, '[');   /* search for opening bracket [ */

    if (!cptr)
    {
        ffpmsg("binary file name missing '[' character (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    *rootfile = '\0';
    strncat(rootfile, filename, cptr - filename);  /* store the rootname */

    cptr++;

    while (*cptr == ' ')
       cptr++;    /* skip leading blanks */

    /* Get the Data Type of the Image */

    if (*cptr == 'b' || *cptr == 'B')
    {
      datatype = BYTE_IMG;
      bytePerPix = 1;
    }
    else if (*cptr == 'i' || *cptr == 'I')
    {
      datatype = SHORT_IMG;
      bytePerPix = 2;
    }
    else if (*cptr == 'u' || *cptr == 'U')
    {
      datatype = USHORT_IMG;
      bytePerPix = 2;

    }
    else if (*cptr == 'j' || *cptr == 'J')
    {
      datatype = LONG_IMG;
      bytePerPix = 4;
    }  
    else if (*cptr == 'r' || *cptr == 'R' || *cptr == 'f' || *cptr == 'F')
    {
      datatype = FLOAT_IMG;
      bytePerPix = 4;
    }    
    else if (*cptr == 'd' || *cptr == 'D')
    {
      datatype = DOUBLE_IMG;
      bytePerPix = 8;
    }
    else
    {
        ffpmsg("error in raw binary file datatype (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    cptr++;

    /* get Endian: Big or Little; default is same as the local machine */
    
    if (*cptr == 'b' || *cptr == 'B')
    {
        endian = 0;
        cptr++;
    }
    else if (*cptr == 'l' || *cptr == 'L')
    {
        endian = 1;
        cptr++;
    }
    else
        endian = BYTESWAPPED; /* byteswapped machines are little endian */

    /* read each dimension (up to 5) */

    naxis = 1;
    dim[0] = strtol(cptr, &cptr2, 10);
    
    if (cptr2 && *cptr2 == ',')
    {
      naxis = 2;
      dim[1] = strtol(cptr2+1, &cptr, 10);

      if (cptr && *cptr == ',')
      {
        naxis = 3;
        dim[2] = strtol(cptr+1, &cptr2, 10);

        if (cptr2 && *cptr2 == ',')
        {
          naxis = 4;
          dim[3] = strtol(cptr2+1, &cptr, 10);

          if (cptr && *cptr == ',')
            naxis = 5;
            dim[4] = strtol(cptr+1, &cptr2, 10);
        }
      }
    }

    cptr = maxvalue(cptr, cptr2);

    if (*cptr == ':')   /* read starting offset value */
        offset = strtol(cptr+1, 0, 10);

    nvals = dim[0] * dim[1] * dim[2] * dim[3] * dim[4];
    datasize = nvals * bytePerPix;
    filesize = nvals * bytePerPix + 2880;
    filesize = ((filesize - 1) / 2880 + 1) * 2880; 

    /* open the raw binary disk file */
    status = file_openfile(rootfile, READONLY, &diskfile);
    if (status)
    {
        ffpmsg("failed to open raw  binary file (mem_rawfile_open)");
        ffpmsg(rootfile);
        return(status);
    }

    /* create a memory file with corrct size for the FITS converted raw file */
    status = mem_createmem(filesize, hdl);
    if (status)
    {
        ffpmsg("failed to create memory file (mem_rawfile_open)");
        fclose(diskfile);
        return(status);
    }

    /* open this piece of memory as a new FITS file */
    ffimem(&fptr, (void **) memTable[*hdl].memaddrptr, &filesize, 0, 0, &status);

    /* write the required header keywords */
    ffcrim(fptr, datatype, naxis, dim, &status);

    /* close the FITS file, but keep the memory allocated */
    ffclos(fptr, &status);

    if (status > 0)
    {
        ffpmsg("failed to write basic image header (mem_rawfile_open)");
        fclose(diskfile);
        mem_close_free(*hdl);   /* free up the memory */
        return(status);
    }

    if (offset > 0)
       fseek(diskfile, offset, 0);   /* offset to start of the data */

    /* read the raw data into memory */
    ptr = *memTable[*hdl].memaddrptr + 2880;

    if (fread((char *) ptr, 1, datasize, diskfile) != datasize)
      status = READ_ERROR;

    fclose(diskfile);  /* close the raw binary disk file */

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to copy raw file data into memory (mem_rawfile_open)");
        return(status);
    }

    if (datatype == USHORT_IMG)  /* have to subtract 32768 from each unsigned */
    {                            /* value to conform to FITS convention. More */
                                 /* efficient way to do this is to just flip  */
                                 /* the most significant bit.                 */

      sptr = (short *) ptr;

      if (endian == BYTESWAPPED)  /* working with native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x8000;
        }
      }
      else  /* pixels are byteswapped WRT the native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x80;
        }
      }
    }

    if (endian)  /* swap the bytes if array is in little endian byte order */
    {
      if (datatype == SHORT_IMG || datatype == USHORT_IMG)
      {
        ffswap2( (short *) ptr, nvals);
      }
      else if (datatype == LONG_IMG || datatype == FLOAT_IMG)
      {
        ffswap4( (INT32BIT *) ptr, nvals);
      }

      else if (datatype == DOUBLE_IMG)
      {
        ffswap8( (double *) ptr, nvals);
      }
    }

    memTable[*hdl].currentpos = 0;           /* save starting position */
    memTable[*hdl].fitsfilesize=filesize;    /* and initial file size  */

    return(0);
}